

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_color.cpp
# Opt level: O0

void __thiscall ON_Color::ON_Color(ON_Color *this,int r,int g,int b)

{
  int b_local;
  int g_local;
  int r_local;
  ON_Color *this_local;
  
  (this->field_0).m_color = 0;
  SetRGB(this,r,g,b);
  return;
}

Assistant:

ON_Color::ON_Color(int r, int g, int b)
{
  SetRGB(r,g,b);
}